

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall DHPrivateKey::serialise(DHPrivateKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff50;
  ByteString *in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff78;
  
  ByteString::serialise(in_stack_ffffffffffffff78);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::~ByteString((ByteString *)0x14dc03);
  ByteString::~ByteString((ByteString *)0x14dc10);
  ByteString::~ByteString((ByteString *)0x14dc1a);
  ByteString::~ByteString((ByteString *)0x14dc24);
  return in_RDI;
}

Assistant:

ByteString DHPrivateKey::serialise() const
{
	return p.serialise() +
	       g.serialise() +
	       x.serialise();
}